

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppCustomRendering(bool *p_open)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  ImU32 col_upr_left;
  ImU32 col_upr_right;
  int iVar4;
  ImGuiStyle *pIVar5;
  ImGuiIO *pIVar6;
  ImVec2 *pIVar7;
  ImDrawList *pIVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  float local_38c;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  ImVec2 local_2a8;
  ImVec2 window_center;
  ImVec2 window_size;
  ImVec2 window_pos;
  ImVec2 local_288;
  int local_280;
  int n_1;
  ImVec2 local_274;
  float local_26c;
  float y_1;
  ImVec2 local_260;
  float local_258;
  undefined4 local_254;
  float x_1;
  float GRID_STEP;
  ImVec2 drag_delta;
  float mouse_threshold_for_pan;
  ImVec2 mouse_pos_in_canvas;
  ImVec2 origin;
  bool is_active;
  bool is_hovered;
  ImDrawList *draw_list_1;
  ImGuiIO *io;
  float local_218;
  ImVec2 canvas_p1;
  ImVec2 canvas_sz;
  ImVec2 canvas_p0;
  ImVec2 local_1f8;
  ImVec2 local_1f0;
  ImVec2 local_1e8;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  ImVec2 local_1c8;
  ImVec2 local_1c0;
  ImVec2 local_1b8;
  ImVec2 local_1b0;
  ImVec2 local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 cp4 [4];
  ImVec2 cp3 [3];
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  float local_90;
  int local_8c;
  float th;
  int n;
  float y;
  float x;
  int curve_segments;
  int circle_segments;
  float rounding;
  ImDrawFlags corners_tl_br;
  float spacing;
  ImU32 local_5c;
  float fStack_58;
  ImU32 col;
  ImVec2 p;
  ImU32 col_b_1;
  ImU32 col_a_1;
  ImVec2 p1_1;
  ImVec2 p0_1;
  ImU32 col_b;
  ImU32 col_a;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 gradient_size;
  ImDrawList *draw_list;
  bool *p_open_local;
  
  bVar2 = ImGui::Begin("Example: Custom rendering",p_open,0);
  if (bVar2) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
                 ,0x1d14,"Examples/Custom Rendering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar2 = ImGui::BeginTabBar("##TabBar",0);
    if (bVar2) {
      bVar2 = ImGui::BeginTabItem("Primitives",(bool *)0x0,0);
      if (bVar2) {
        fVar9 = ImGui::GetFontSize();
        ImGui::PushItemWidth(fVar9 * -15.0);
        pIVar8 = ImGui::GetWindowDrawList();
        ImGui::Text("Gradients");
        fVar9 = ImGui::CalcItemWidth();
        fVar10 = ImGui::GetFrameHeight();
        ImVec2::ImVec2(&p0,fVar9,fVar10);
        p1 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2((ImVec2 *)&col_b,p1.x + p0.x,p1.y + p0.y);
        col_upr_left = ImGui::GetColorU32(0xff000000);
        col_upr_right = ImGui::GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar8,&p1,(ImVec2 *)&col_b,col_upr_left,col_upr_right,col_upr_right,col_upr_left
                  );
        ImGui::InvisibleButton("##gradient1",&p0,0);
        p1_1 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2((ImVec2 *)&col_b_1,p1_1.x + p0.x,p1_1.y + p0.y);
        p.y = (float)ImGui::GetColorU32(0xff00ff00);
        p.x = (float)ImGui::GetColorU32(0xff0000ff);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar8,&p1_1,(ImVec2 *)&col_b_1,(ImU32)p.y,(ImU32)p.x,(ImU32)p.x,(ImU32)p.y);
        ImGui::InvisibleButton("##gradient2",&p0,0);
        ImGui::Text("All primitives");
        ImGui::DragFloat("Size",&ShowExampleAppCustomRendering::sz,0.2,2.0,100.0,"%.0f",0);
        ImGui::DragFloat("Thickness",&ShowExampleAppCustomRendering::thickness,0.05,1.0,8.0,"%.02f",
                         0);
        ImGui::SliderInt("N-gon sides",&ShowExampleAppCustomRendering::ngon_sides,3,0xc,"%d",0);
        ImGui::Checkbox("##circlesegmentoverride",
                        &ShowExampleAppCustomRendering::circle_segments_override);
        pIVar5 = ImGui::GetStyle();
        ImGui::SameLine(0.0,(pIVar5->ItemInnerSpacing).x);
        bVar2 = ImGui::SliderInt("Circle segments override",
                                 &ShowExampleAppCustomRendering::circle_segments_override_v,3,0x28,
                                 "%d",0);
        ShowExampleAppCustomRendering::circle_segments_override =
             (bool)(ShowExampleAppCustomRendering::circle_segments_override & 1U | bVar2);
        ImGui::Checkbox("##curvessegmentoverride",
                        &ShowExampleAppCustomRendering::curve_segments_override);
        pIVar5 = ImGui::GetStyle();
        ImGui::SameLine(0.0,(pIVar5->ItemInnerSpacing).x);
        bVar2 = ImGui::SliderInt("Curves segments override",
                                 &ShowExampleAppCustomRendering::curve_segments_override_v,3,0x28,
                                 "%d",0);
        ShowExampleAppCustomRendering::curve_segments_override =
             (bool)(ShowExampleAppCustomRendering::curve_segments_override & 1U | bVar2);
        ImGui::ColorEdit4("Color",&ShowExampleAppCustomRendering::colf.x,0);
        _fStack_58 = ImGui::GetCursorScreenPos();
        ImColor::ImColor((ImColor *)&corners_tl_br,&ShowExampleAppCustomRendering::colf);
        local_5c = ImColor::operator_cast_to_unsigned_int((ImColor *)&corners_tl_br);
        rounding = 10.0;
        circle_segments = 0x90;
        curve_segments = (int)(ShowExampleAppCustomRendering::sz / 5.0);
        if ((ShowExampleAppCustomRendering::circle_segments_override & 1U) == 0) {
          local_2e8 = 0.0;
        }
        else {
          local_2e8 = (float)ShowExampleAppCustomRendering::circle_segments_override_v;
        }
        x = local_2e8;
        if ((ShowExampleAppCustomRendering::curve_segments_override & 1U) == 0) {
          local_2ec = 0.0;
        }
        else {
          local_2ec = (float)ShowExampleAppCustomRendering::curve_segments_override_v;
        }
        y = local_2ec;
        th = (float)col + 4.0;
        for (local_8c = 0; n = (int)(fStack_58 + 4.0), local_8c < 2; local_8c = local_8c + 1) {
          if (local_8c == 0) {
            local_2f0 = 1.0;
          }
          else {
            local_2f0 = ShowExampleAppCustomRendering::thickness;
          }
          local_90 = local_2f0;
          ImVec2::ImVec2(&local_98,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.5 + th);
          ImDrawList::AddNgon(pIVar8,&local_98,ShowExampleAppCustomRendering::sz * 0.5,local_5c,
                              ShowExampleAppCustomRendering::ngon_sides,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_a0,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.5 + th);
          ImDrawList::AddCircle
                    (pIVar8,&local_a0,ShowExampleAppCustomRendering::sz * 0.5,local_5c,(int)x,
                     local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_a8,(float)n,th);
          ImVec2::ImVec2(&local_b0,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar8,&local_a8,&local_b0,local_5c,0.0,0,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_b8,(float)n,th);
          ImVec2::ImVec2(&local_c0,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar8,&local_b8,&local_c0,local_5c,(float)curve_segments,0,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_c8,(float)n,th);
          ImVec2::ImVec2(&local_d0,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(pIVar8,&local_c8,&local_d0,local_5c,(float)curve_segments,0x90,
                              local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_d8,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,th);
          ImVec2::ImVec2(&local_e0,(float)n + ShowExampleAppCustomRendering::sz,
                         (th + ShowExampleAppCustomRendering::sz) - 0.5);
          ImVec2::ImVec2(&local_e8,(float)n,(th + ShowExampleAppCustomRendering::sz) - 0.5);
          ImDrawList::AddTriangle(pIVar8,&local_d8,&local_e0,&local_e8,local_5c,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_f0,(float)n,th);
          ImVec2::ImVec2(&local_f8,(float)n + ShowExampleAppCustomRendering::sz,th);
          ImDrawList::AddLine(pIVar8,&local_f0,&local_f8,local_5c,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_100,(float)n,th);
          ImVec2::ImVec2(&local_108,(float)n,th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(pIVar8,&local_100,&local_108,local_5c,local_90);
          n = (int)((float)n + 10.0);
          ImVec2::ImVec2(&local_110,(float)n,th);
          ImVec2::ImVec2(&local_118,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(pIVar8,&local_110,&local_118,local_5c,local_90);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(cp4 + 3,(float)n,ShowExampleAppCustomRendering::sz * 0.6 + th);
          ImVec2::ImVec2(cp3,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                         -ShowExampleAppCustomRendering::sz * 0.4 + th);
          ImVec2::ImVec2(cp3 + 1,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierQuadratic(pIVar8,cp4 + 3,cp3,cp3 + 1,local_5c,local_90,(int)y);
          n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
          ImVec2::ImVec2(&local_158,(float)n,th);
          ImVec2::ImVec2(cp4,ShowExampleAppCustomRendering::sz * 1.3 + (float)n,
                         ShowExampleAppCustomRendering::sz * 0.3 + th);
          ImVec2::ImVec2(cp4 + 1,-ShowExampleAppCustomRendering::sz * 1.3 +
                                 (float)n + ShowExampleAppCustomRendering::sz,
                         -ShowExampleAppCustomRendering::sz * 0.3 +
                         th + ShowExampleAppCustomRendering::sz);
          ImVec2::ImVec2(cp4 + 2,(float)n + ShowExampleAppCustomRendering::sz,
                         th + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierCubic(pIVar8,&local_158,cp4,cp4 + 1,cp4 + 2,local_5c,local_90,(int)y)
          ;
          th = ShowExampleAppCustomRendering::sz + 10.0 + th;
        }
        ImVec2::ImVec2(&local_160,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                       ShowExampleAppCustomRendering::sz * 0.5 + th);
        ImDrawList::AddNgonFilled
                  (pIVar8,&local_160,ShowExampleAppCustomRendering::sz * 0.5,local_5c,
                   ShowExampleAppCustomRendering::ngon_sides);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_168,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,
                       ShowExampleAppCustomRendering::sz * 0.5 + th);
        ImDrawList::AddCircleFilled
                  (pIVar8,&local_168,ShowExampleAppCustomRendering::sz * 0.5,local_5c,(int)x);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_170,(float)n,th);
        ImVec2::ImVec2(&local_178,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar8,&local_170,&local_178,local_5c,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_180,(float)n,th);
        ImVec2::ImVec2(&local_188,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar8,&local_180,&local_188,local_5c,10.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_190,(float)n,th);
        ImVec2::ImVec2(&local_198,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar8,&local_190,&local_198,local_5c,10.0,0x90);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1a0,ShowExampleAppCustomRendering::sz * 0.5 + (float)n,th);
        ImVec2::ImVec2(&local_1a8,(float)n + ShowExampleAppCustomRendering::sz,
                       (th + ShowExampleAppCustomRendering::sz) - 0.5);
        ImVec2::ImVec2(&local_1b0,(float)n,(th + ShowExampleAppCustomRendering::sz) - 0.5);
        ImDrawList::AddTriangleFilled(pIVar8,&local_1a0,&local_1a8,&local_1b0,local_5c);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1b8,(float)n,th);
        ImVec2::ImVec2(&local_1c0,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::thickness);
        ImDrawList::AddRectFilled(pIVar8,&local_1b8,&local_1c0,local_5c,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + 10.0 + (float)n);
        ImVec2::ImVec2(&local_1c8,(float)n,th);
        ImVec2::ImVec2(&local_1d0,(float)n + ShowExampleAppCustomRendering::thickness,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled(pIVar8,&local_1c8,&local_1d0,local_5c,0.0,0);
        n = (int)((float)n + 20.0);
        ImVec2::ImVec2(&local_1d8,(float)n,th);
        ImVec2::ImVec2(&local_1e0,(float)n + 1.0,th + 1.0);
        ImDrawList::AddRectFilled(pIVar8,&local_1d8,&local_1e0,local_5c,0.0,0);
        n = (int)(ShowExampleAppCustomRendering::sz + (float)n);
        ImVec2::ImVec2(&local_1e8,(float)n,th);
        ImVec2::ImVec2(&local_1f0,(float)n + ShowExampleAppCustomRendering::sz,
                       th + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilledMultiColor
                  (pIVar8,&local_1e8,&local_1f0,0xff000000,0xff0000ff,0xff00ffff,0xff00ff00);
        ImVec2::ImVec2(&local_1f8,(ShowExampleAppCustomRendering::sz + 10.0) * 10.2,
                       (ShowExampleAppCustomRendering::sz + 10.0) * 3.0);
        ImGui::Dummy(&local_1f8);
        ImGui::PopItemWidth();
        ImGui::EndTabItem();
      }
      bVar2 = ImGui::BeginTabItem("Canvas",(bool *)0x0,0);
      if (bVar2) {
        if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
           (iVar4 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar4 != 0))
        {
          ImVector<ImVec2>::ImVector(&ShowExampleAppCustomRendering::points);
          __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering::points,
                       &__dso_handle);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
        }
        ImGui::Checkbox("Enable grid",&ShowExampleAppCustomRendering::opt_enable_grid);
        ImGui::Checkbox("Enable context menu",
                        &ShowExampleAppCustomRendering::opt_enable_context_menu);
        ImGui::Text(
                   "Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu."
                   );
        canvas_sz = ImGui::GetCursorScreenPos();
        canvas_p1 = ImGui::GetContentRegionAvail();
        if (canvas_p1.x < 50.0) {
          canvas_p1.x = 50.0;
        }
        if (canvas_p1.y < 50.0) {
          canvas_p1.y = 50.0;
        }
        ImVec2::ImVec2((ImVec2 *)((long)&io + 4),canvas_sz.x + canvas_p1.x,canvas_sz.y + canvas_p1.y
                      );
        pIVar6 = ImGui::GetIO();
        pIVar8 = ImGui::GetWindowDrawList();
        ImDrawList::AddRectFilled(pIVar8,&canvas_sz,(ImVec2 *)((long)&io + 4),0xff323232,0.0,0);
        ImDrawList::AddRect(pIVar8,&canvas_sz,(ImVec2 *)((long)&io + 4),0xffffffff,0.0,0,1.0);
        ImGui::InvisibleButton("canvas",&canvas_p1,3);
        bVar2 = ImGui::IsItemHovered(0);
        bVar3 = ImGui::IsItemActive();
        ImVec2::ImVec2(&mouse_pos_in_canvas,canvas_sz.x + ShowExampleAppCustomRendering::scrolling.x
                       ,canvas_sz.y + ShowExampleAppCustomRendering::scrolling.y);
        ImVec2::ImVec2((ImVec2 *)&drag_delta.y,(pIVar6->MousePos).x - mouse_pos_in_canvas.x,
                       (pIVar6->MousePos).y - mouse_pos_in_canvas.y);
        if (((bVar2) && ((ShowExampleAppCustomRendering::adding_line & 1U) == 0)) &&
           (bVar2 = ImGui::IsMouseClicked(0,false), bVar2)) {
          ImVector<ImVec2>::push_back
                    (&ShowExampleAppCustomRendering::points,(ImVec2 *)&drag_delta.y);
          ImVector<ImVec2>::push_back
                    (&ShowExampleAppCustomRendering::points,(ImVec2 *)&drag_delta.y);
          ShowExampleAppCustomRendering::adding_line = true;
        }
        if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
          pIVar7 = ImVector<ImVec2>::back(&ShowExampleAppCustomRendering::points);
          *pIVar7 = stack0xfffffffffffffdbc;
          bVar2 = ImGui::IsMouseDown(0);
          if (!bVar2) {
            ShowExampleAppCustomRendering::adding_line = false;
          }
        }
        local_38c = -1.0;
        if ((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) == 0) {
          local_38c = 0.0;
        }
        drag_delta.x = local_38c;
        if ((bVar3) && (bVar2 = ImGui::IsMouseDragging(1,local_38c), bVar2)) {
          ShowExampleAppCustomRendering::scrolling.x =
               (pIVar6->MouseDelta).x + ShowExampleAppCustomRendering::scrolling.x;
          ShowExampleAppCustomRendering::scrolling.y =
               (pIVar6->MouseDelta).y + ShowExampleAppCustomRendering::scrolling.y;
        }
        _x_1 = ImGui::GetMouseDragDelta(1,-1.0);
        if (((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) != 0) && (x_1 == 0.0)) {
          if ((GRID_STEP == 0.0) && (!NAN(GRID_STEP))) {
            ImGui::OpenPopupOnItemClick("context",1);
          }
        }
        bVar2 = ImGui::BeginPopup("context",0);
        if (bVar2) {
          if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
            iVar4 = ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize(&ShowExampleAppCustomRendering::points,iVar4 + -2);
          }
          ShowExampleAppCustomRendering::adding_line = false;
          bVar2 = ImGui::MenuItem("Remove one",(char *)0x0,false,
                                  0 < ShowExampleAppCustomRendering::points.Size);
          if (bVar2) {
            iVar4 = ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize(&ShowExampleAppCustomRendering::points,iVar4 + -2);
          }
          bVar2 = ImGui::MenuItem("Remove all",(char *)0x0,false,
                                  0 < ShowExampleAppCustomRendering::points.Size);
          if (bVar2) {
            ImVector<ImVec2>::clear(&ShowExampleAppCustomRendering::points);
          }
          ImGui::EndPopup();
        }
        ImDrawList::PushClipRect(pIVar8,&canvas_sz,(ImVec2 *)((long)&io + 4),true);
        if ((ShowExampleAppCustomRendering::opt_enable_grid & 1U) != 0) {
          local_254 = 0x42800000;
          for (local_258 = fmodf(ShowExampleAppCustomRendering::scrolling.x,64.0);
              local_258 < canvas_p1.x; local_258 = local_258 + 64.0) {
            ImVec2::ImVec2(&local_260,canvas_sz.x + local_258,canvas_sz.y);
            ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd98,canvas_sz.x + local_258,local_218);
            ImDrawList::AddLine(pIVar8,&local_260,(ImVec2 *)&stack0xfffffffffffffd98,0x28c8c8c8,1.0)
            ;
          }
          for (local_26c = fmodf(ShowExampleAppCustomRendering::scrolling.y,64.0);
              local_26c < canvas_p1.y; local_26c = local_26c + 64.0) {
            ImVec2::ImVec2(&local_274,canvas_sz.x,canvas_sz.y + local_26c);
            ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffd84,io._4_4_,canvas_sz.y + local_26c);
            ImDrawList::AddLine(pIVar8,&local_274,(ImVec2 *)&stack0xfffffffffffffd84,0x28c8c8c8,1.0)
            ;
          }
        }
        for (local_280 = 0; fVar9 = mouse_pos_in_canvas.x,
            local_280 < ShowExampleAppCustomRendering::points.Size; local_280 = local_280 + 2) {
          pIVar7 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_280);
          fVar1 = mouse_pos_in_canvas.y;
          fVar10 = pIVar7->x;
          pIVar7 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_280);
          ImVec2::ImVec2(&local_288,fVar9 + fVar10,fVar1 + pIVar7->y);
          fVar10 = mouse_pos_in_canvas.x;
          pIVar7 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_280 + 1);
          fVar1 = mouse_pos_in_canvas.y;
          fVar9 = pIVar7->x;
          pIVar7 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_280 + 1);
          ImVec2::ImVec2(&window_pos,fVar10 + fVar9,fVar1 + pIVar7->y);
          ImDrawList::AddLine(pIVar8,&local_288,&window_pos,0xff00ffff,2.0);
        }
        ImDrawList::PopClipRect(pIVar8);
        ImGui::EndTabItem();
      }
      bVar2 = ImGui::BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
      if (bVar2) {
        ImGui::Checkbox("Draw in Background draw list",&ShowExampleAppCustomRendering::draw_bg);
        ImGui::SameLine(0.0,-1.0);
        HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
        ImGui::Checkbox("Draw in Foreground draw list",&ShowExampleAppCustomRendering::draw_fg);
        ImGui::SameLine(0.0,-1.0);
        HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
        IVar11 = ImGui::GetWindowPos();
        window_center = ImGui::GetWindowSize();
        window_size.x = IVar11.x;
        window_size.y = IVar11.y;
        ImVec2::ImVec2(&local_2a8,window_center.x * 0.5 + window_size.x,
                       window_center.y * 0.5 + window_size.y);
        if ((ShowExampleAppCustomRendering::draw_bg & 1U) != 0) {
          pIVar8 = ImGui::GetBackgroundDrawList();
          ImDrawList::AddCircle(pIVar8,&local_2a8,window_center.x * 0.6,0xc80000ff,0,14.0);
        }
        if ((ShowExampleAppCustomRendering::draw_fg & 1U) != 0) {
          pIVar8 = ImGui::GetForegroundDrawList();
          ImDrawList::AddCircle(pIVar8,&local_2a8,window_center.y * 0.6,0xc800ff00,0,10.0);
        }
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppCustomRendering(bool* p_open)
{
    if (!ImGui::Begin("Example: Custom rendering", p_open))
    {
        ImGui::End();
        return;
    }
    IMGUI_DEMO_MARKER("Examples/Custom Rendering");

    // Tip: If you do a lot of custom rendering, you probably want to use your own geometrical types and benefit of
    // overloaded operators, etc. Define IM_VEC2_CLASS_EXTRA in imconfig.h to create implicit conversions between your
    // types and ImVec2/ImVec4. Dear ImGui defines overloaded operators but they are internal to imgui.cpp and not
    // exposed outside (to avoid messing with your types) In this example we are not using the maths operators!

    if (ImGui::BeginTabBar("##TabBar"))
    {
        if (ImGui::BeginTabItem("Primitives"))
        {
            ImGui::PushItemWidth(-ImGui::GetFontSize() * 15);
            ImDrawList* draw_list = ImGui::GetWindowDrawList();

            // Draw gradients
            // (note that those are currently exacerbating our sRGB/Linear issues)
            // Calling ImGui::GetColorU32() multiplies the given colors by the current Style Alpha, but you may pass the IM_COL32() directly as well..
            ImGui::Text("Gradients");
            ImVec2 gradient_size = ImVec2(ImGui::CalcItemWidth(), ImGui::GetFrameHeight());
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 0, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 255, 255, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient1", gradient_size);
            }
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 255, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 0, 0, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient2", gradient_size);
            }

            // Draw a bunch of primitives
            ImGui::Text("All primitives");
            static float sz = 36.0f;
            static float thickness = 3.0f;
            static int ngon_sides = 6;
            static bool circle_segments_override = false;
            static int circle_segments_override_v = 12;
            static bool curve_segments_override = false;
            static int curve_segments_override_v = 8;
            static ImVec4 colf = ImVec4(1.0f, 1.0f, 0.4f, 1.0f);
            ImGui::DragFloat("Size", &sz, 0.2f, 2.0f, 100.0f, "%.0f");
            ImGui::DragFloat("Thickness", &thickness, 0.05f, 1.0f, 8.0f, "%.02f");
            ImGui::SliderInt("N-gon sides", &ngon_sides, 3, 12);
            ImGui::Checkbox("##circlesegmentoverride", &circle_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            circle_segments_override |= ImGui::SliderInt("Circle segments override", &circle_segments_override_v, 3, 40);
            ImGui::Checkbox("##curvessegmentoverride", &curve_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            curve_segments_override |= ImGui::SliderInt("Curves segments override", &curve_segments_override_v, 3, 40);
            ImGui::ColorEdit4("Color", &colf.x);

            const ImVec2 p = ImGui::GetCursorScreenPos();
            const ImU32 col = ImColor(colf);
            const float spacing = 10.0f;
            const ImDrawFlags corners_tl_br = ImDrawFlags_RoundCornersTopLeft | ImDrawFlags_RoundCornersBottomRight;
            const float rounding = sz / 5.0f;
            const int circle_segments = circle_segments_override ? circle_segments_override_v : 0;
            const int curve_segments = curve_segments_override ? curve_segments_override_v : 0;
            float x = p.x + 4.0f;
            float y = p.y + 4.0f;
            for (int n = 0; n < 2; n++)
            {
                // First line uses a thickness of 1.0f, second line uses the configurable thickness
                float th = (n == 0) ? 1.0f : thickness;
                draw_list->AddNgon(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, ngon_sides, th);                 x += sz + spacing;  // N-gon
                draw_list->AddCircle(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments, th);          x += sz + spacing;  // Circle
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 0.0f, ImDrawFlags_None, th);          x += sz + spacing;  // Square
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, ImDrawFlags_None, th);      x += sz + spacing;  // Square with all rounded corners
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, corners_tl_br, th);         x += sz + spacing;  // Square with two rounded corners
                draw_list->AddTriangle(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col, th);x += sz + spacing;  // Triangle
                //draw_list->AddTriangle(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col, th);x+= sz*0.4f + spacing; // Thin triangle
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y), col, th);                                       x += sz + spacing;  // Horizontal line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x, y + sz), col, th);                                       x += spacing;       // Vertical line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y + sz), col, th);                                  x += sz + spacing;  // Diagonal line

                // Quadratic Bezier Curve (3 control points)
                ImVec2 cp3[3] = { ImVec2(x, y + sz * 0.6f), ImVec2(x + sz * 0.5f, y - sz * 0.4f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierQuadratic(cp3[0], cp3[1], cp3[2], col, th, curve_segments); x += sz + spacing;

                // Cubic Bezier Curve (4 control points)
                ImVec2 cp4[4] = { ImVec2(x, y), ImVec2(x + sz * 1.3f, y + sz * 0.3f), ImVec2(x + sz - sz * 1.3f, y + sz - sz * 0.3f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierCubic(cp4[0], cp4[1], cp4[2], cp4[3], col, th, curve_segments);

                x = p.x + 4;
                y += sz + spacing;
            }
            draw_list->AddNgonFilled(ImVec2(x + sz * 0.5f, y + sz * 0.5f), sz*0.5f, col, ngon_sides);               x += sz + spacing;  // N-gon
            draw_list->AddCircleFilled(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments);            x += sz + spacing;  // Circle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col);                                    x += sz + spacing;  // Square
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f);                             x += sz + spacing;  // Square with all rounded corners
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f, corners_tl_br);              x += sz + spacing;  // Square with two rounded corners
            draw_list->AddTriangleFilled(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col);  x += sz + spacing;  // Triangle
            //draw_list->AddTriangleFilled(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col); x += sz*0.4f + spacing; // Thin triangle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + thickness), col);                             x += sz + spacing;  // Horizontal line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + thickness, y + sz), col);                             x += spacing * 2.0f;// Vertical line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + 1, y + 1), col);                                      x += sz;            // Pixel (faster than AddLine)
            draw_list->AddRectFilledMultiColor(ImVec2(x, y), ImVec2(x + sz, y + sz), IM_COL32(0, 0, 0, 255), IM_COL32(255, 0, 0, 255), IM_COL32(255, 255, 0, 255), IM_COL32(0, 255, 0, 255));

            ImGui::Dummy(ImVec2((sz + spacing) * 10.2f, (sz + spacing) * 3.0f));
            ImGui::PopItemWidth();
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Canvas"))
        {
            static ImVector<ImVec2> points;
            static ImVec2 scrolling(0.0f, 0.0f);
            static bool opt_enable_grid = true;
            static bool opt_enable_context_menu = true;
            static bool adding_line = false;

            ImGui::Checkbox("Enable grid", &opt_enable_grid);
            ImGui::Checkbox("Enable context menu", &opt_enable_context_menu);
            ImGui::Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");

            // Typically you would use a BeginChild()/EndChild() pair to benefit from a clipping region + own scrolling.
            // Here we demonstrate that this can be replaced by simple offsetting + custom drawing + PushClipRect/PopClipRect() calls.
            // To use a child window instead we could use, e.g:
            //      ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));      // Disable padding
            //      ImGui::PushStyleColor(ImGuiCol_ChildBg, IM_COL32(50, 50, 50, 255));  // Set a background color
            //      ImGui::BeginChild("canvas", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_NoMove);
            //      ImGui::PopStyleColor();
            //      ImGui::PopStyleVar();
            //      [...]
            //      ImGui::EndChild();

            // Using InvisibleButton() as a convenience 1) it will advance the layout cursor and 2) allows us to use IsItemHovered()/IsItemActive()
            ImVec2 canvas_p0 = ImGui::GetCursorScreenPos();      // ImDrawList API uses screen coordinates!
            ImVec2 canvas_sz = ImGui::GetContentRegionAvail();   // Resize canvas to what's available
            if (canvas_sz.x < 50.0f) canvas_sz.x = 50.0f;
            if (canvas_sz.y < 50.0f) canvas_sz.y = 50.0f;
            ImVec2 canvas_p1 = ImVec2(canvas_p0.x + canvas_sz.x, canvas_p0.y + canvas_sz.y);

            // Draw border and background color
            ImGuiIO& io = ImGui::GetIO();
            ImDrawList* draw_list = ImGui::GetWindowDrawList();
            draw_list->AddRectFilled(canvas_p0, canvas_p1, IM_COL32(50, 50, 50, 255));
            draw_list->AddRect(canvas_p0, canvas_p1, IM_COL32(255, 255, 255, 255));

            // This will catch our interactions
            ImGui::InvisibleButton("canvas", canvas_sz, ImGuiButtonFlags_MouseButtonLeft | ImGuiButtonFlags_MouseButtonRight);
            const bool is_hovered = ImGui::IsItemHovered(); // Hovered
            const bool is_active = ImGui::IsItemActive();   // Held
            const ImVec2 origin(canvas_p0.x + scrolling.x, canvas_p0.y + scrolling.y); // Lock scrolled origin
            const ImVec2 mouse_pos_in_canvas(io.MousePos.x - origin.x, io.MousePos.y - origin.y);

            // Add first and second point
            if (is_hovered && !adding_line && ImGui::IsMouseClicked(ImGuiMouseButton_Left))
            {
                points.push_back(mouse_pos_in_canvas);
                points.push_back(mouse_pos_in_canvas);
                adding_line = true;
            }
            if (adding_line)
            {
                points.back() = mouse_pos_in_canvas;
                if (!ImGui::IsMouseDown(ImGuiMouseButton_Left))
                    adding_line = false;
            }

            // Pan (we use a zero mouse threshold when there's no context menu)
            // You may decide to make that threshold dynamic based on whether the mouse is hovering something etc.
            const float mouse_threshold_for_pan = opt_enable_context_menu ? -1.0f : 0.0f;
            if (is_active && ImGui::IsMouseDragging(ImGuiMouseButton_Right, mouse_threshold_for_pan))
            {
                scrolling.x += io.MouseDelta.x;
                scrolling.y += io.MouseDelta.y;
            }

            // Context menu (under default mouse threshold)
            ImVec2 drag_delta = ImGui::GetMouseDragDelta(ImGuiMouseButton_Right);
            if (opt_enable_context_menu && drag_delta.x == 0.0f && drag_delta.y == 0.0f)
                ImGui::OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
            if (ImGui::BeginPopup("context"))
            {
                if (adding_line)
                    points.resize(points.size() - 2);
                adding_line = false;
                if (ImGui::MenuItem("Remove one", NULL, false, points.Size > 0)) { points.resize(points.size() - 2); }
                if (ImGui::MenuItem("Remove all", NULL, false, points.Size > 0)) { points.clear(); }
                ImGui::EndPopup();
            }

            // Draw grid + all lines in the canvas
            draw_list->PushClipRect(canvas_p0, canvas_p1, true);
            if (opt_enable_grid)
            {
                const float GRID_STEP = 64.0f;
                for (float x = fmodf(scrolling.x, GRID_STEP); x < canvas_sz.x; x += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x + x, canvas_p0.y), ImVec2(canvas_p0.x + x, canvas_p1.y), IM_COL32(200, 200, 200, 40));
                for (float y = fmodf(scrolling.y, GRID_STEP); y < canvas_sz.y; y += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x, canvas_p0.y + y), ImVec2(canvas_p1.x, canvas_p0.y + y), IM_COL32(200, 200, 200, 40));
            }
            for (int n = 0; n < points.Size; n += 2)
                draw_list->AddLine(ImVec2(origin.x + points[n].x, origin.y + points[n].y), ImVec2(origin.x + points[n + 1].x, origin.y + points[n + 1].y), IM_COL32(255, 255, 0, 255), 2.0f);
            draw_list->PopClipRect();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("BG/FG draw lists"))
        {
            static bool draw_bg = true;
            static bool draw_fg = true;
            ImGui::Checkbox("Draw in Background draw list", &draw_bg);
            ImGui::SameLine(); HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
            ImGui::Checkbox("Draw in Foreground draw list", &draw_fg);
            ImGui::SameLine(); HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
            ImVec2 window_pos = ImGui::GetWindowPos();
            ImVec2 window_size = ImGui::GetWindowSize();
            ImVec2 window_center = ImVec2(window_pos.x + window_size.x * 0.5f, window_pos.y + window_size.y * 0.5f);
            if (draw_bg)
                ImGui::GetBackgroundDrawList()->AddCircle(window_center, window_size.x * 0.6f, IM_COL32(255, 0, 0, 200), 0, 10 + 4);
            if (draw_fg)
                ImGui::GetForegroundDrawList()->AddCircle(window_center, window_size.y * 0.6f, IM_COL32(0, 255, 0, 200), 0, 10);
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}